

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_decode_1_(int *a,int dn,int sn,int cas)

{
  int iVar1;
  int local_70;
  int local_6c;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_50;
  int local_4c;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int i;
  int cas_local;
  int sn_local;
  int dn_local;
  int *a_local;
  
  if (cas == 0) {
    if ((0 < dn) || (1 < sn)) {
      for (i = 0; i < sn; i = i + 1) {
        if (i + -1 < 0) {
          local_1c = a[1];
        }
        else {
          if (i + -1 < dn) {
            local_20 = a[(i + -1) * 2 + 1];
          }
          else {
            local_20 = a[(dn + -1) * 2 + 1];
          }
          local_1c = local_20;
        }
        if (i < 0) {
          local_28 = a[1];
        }
        else {
          if (i < dn) {
            local_2c = a[i * 2 + 1];
          }
          else {
            local_2c = a[(dn + -1) * 2 + 1];
          }
          local_28 = local_2c;
        }
        a[i << 1] = a[i << 1] - (local_1c + local_28 + 2 >> 2);
      }
      for (i = 0; i < dn; i = i + 1) {
        if (i < 0) {
          local_30 = *a;
        }
        else {
          if (i < sn) {
            local_34 = a[i << 1];
          }
          else {
            local_34 = a[(sn + -1) * 2];
          }
          local_30 = local_34;
        }
        if (i + 1 < 0) {
          local_3c = *a;
        }
        else {
          if (i + 1 < sn) {
            local_40 = a[(i + 1) * 2];
          }
          else {
            local_40 = a[(sn + -1) * 2];
          }
          local_3c = local_40;
        }
        iVar1 = i * 2 + 1;
        a[iVar1] = (local_30 + local_3c >> 1) + a[iVar1];
      }
    }
  }
  else if ((sn == 0) && (dn == 1)) {
    *a = *a / 2;
  }
  else {
    for (i = 0; i < sn; i = i + 1) {
      if (i < 0) {
        local_4c = *a;
      }
      else {
        if (i < dn) {
          local_50 = a[i << 1];
        }
        else {
          local_50 = a[(dn + -1) * 2];
        }
        local_4c = local_50;
      }
      if (i + 1 < 0) {
        local_58 = *a;
      }
      else {
        if (i + 1 < dn) {
          local_5c = a[(i + 1) * 2];
        }
        else {
          local_5c = a[(dn + -1) * 2];
        }
        local_58 = local_5c;
      }
      iVar1 = i * 2 + 1;
      a[iVar1] = a[iVar1] - (local_4c + local_58 + 2 >> 2);
    }
    for (i = 0; i < dn; i = i + 1) {
      if (i < 0) {
        local_60 = a[1];
      }
      else {
        if (i < sn) {
          local_64 = a[i * 2 + 1];
        }
        else {
          local_64 = a[(sn + -1) * 2 + 1];
        }
        local_60 = local_64;
      }
      if (i + -1 < 0) {
        local_6c = a[1];
      }
      else {
        if (i + -1 < sn) {
          local_70 = a[(i + -1) * 2 + 1];
        }
        else {
          local_70 = a[(sn + -1) * 2 + 1];
        }
        local_6c = local_70;
      }
      a[i << 1] = (local_60 + local_6c >> 1) + a[i << 1];
    }
  }
  return;
}

Assistant:

static void dwt_decode_1_(int *a, int dn, int sn, int cas) {
	int i;
	
	if (!cas) {
		if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < sn; i++) S(i) -= (D_(i - 1) + D_(i) + 2) >> 2;
			for (i = 0; i < dn; i++) D(i) += (S_(i) + S_(i + 1)) >> 1;
		}
	} else {
		if (!sn  && dn == 1)          /* NEW :  CASE ONE ELEMENT */
			S(0) /= 2;
		else {
			for (i = 0; i < sn; i++) D(i) -= (SS_(i) + SS_(i + 1) + 2) >> 2;
			for (i = 0; i < dn; i++) S(i) += (DD_(i) + DD_(i - 1)) >> 1;
		}
	}
}